

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_re_range(mpc_val_t *x)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  char *__s;
  size_t sVar4;
  char *in_RDI;
  char *range;
  int comp;
  char *s;
  char *tmp;
  size_t end;
  size_t start;
  size_t j;
  size_t i;
  mpc_parser_t *out;
  char *in_stack_ffffffffffffff20;
  char *local_58;
  ulong local_28;
  ulong local_20;
  mpc_parser_t *local_8;
  
  cVar1 = *in_RDI;
  local_58 = (char *)calloc(1,1);
  if (*in_RDI == '\0') {
    free(local_58);
    free(in_RDI);
    local_8 = mpc_fail(in_stack_ffffffffffffff20);
  }
  else if ((*in_RDI == '^') && (in_RDI[1] == '\0')) {
    free(local_58);
    free(in_RDI);
    local_8 = mpc_fail(in_stack_ffffffffffffff20);
  }
  else {
    for (local_20 = (ulong)(int)(uint)(cVar1 == '^'); sVar3 = strlen(in_RDI), local_20 < sVar3;
        local_20 = local_20 + 1) {
      if (in_RDI[local_20] == '\\') {
        __s = mpc_re_range_escape_char(in_RDI[local_20 + 1]);
        if (__s == (char *)0x0) {
          sVar3 = strlen(local_58);
          local_58 = (char *)realloc(local_58,sVar3 + 2);
          sVar3 = strlen(local_58);
          local_58[sVar3 + 1] = '\0';
          cVar2 = in_RDI[local_20 + 1];
          sVar3 = strlen(local_58);
          local_58[sVar3] = cVar2;
        }
        else {
          sVar3 = strlen(local_58);
          sVar4 = strlen(__s);
          local_58 = (char *)realloc(local_58,sVar3 + sVar4 + 1);
          strcat(local_58,__s);
        }
        local_20 = local_20 + 1;
      }
      else if (in_RDI[local_20] == '-') {
        if ((in_RDI[local_20 + 1] == '\0') || (local_20 == 0)) {
          sVar3 = strlen(local_58);
          local_58 = (char *)realloc(local_58,sVar3 + 2);
          strcat(local_58,"-");
        }
        else {
          cVar2 = in_RDI[local_20 + 1];
          for (local_28 = (ulong)(in_RDI[local_20 - 1] + 1); local_28 <= (ulong)(long)(cVar2 + -1);
              local_28 = local_28 + 1) {
            sVar3 = strlen(local_58);
            local_58 = (char *)realloc(local_58,sVar3 + 3);
            sVar3 = strlen(local_58);
            local_58[sVar3 + 1] = '\0';
            sVar3 = strlen(local_58);
            local_58[sVar3] = (char)local_28;
          }
        }
      }
      else {
        sVar3 = strlen(local_58);
        local_58 = (char *)realloc(local_58,sVar3 + 2);
        sVar3 = strlen(local_58);
        local_58[sVar3 + 1] = '\0';
        cVar2 = in_RDI[local_20];
        sVar3 = strlen(local_58);
        local_58[sVar3] = cVar2;
      }
    }
    if ((cVar1 == '^') == 1) {
      local_8 = mpc_noneof(in_stack_ffffffffffffff20);
    }
    else {
      local_8 = mpc_oneof(in_stack_ffffffffffffff20);
    }
    free(in_RDI);
    free(local_58);
  }
  return local_8;
}

Assistant:

static mpc_val_t *mpcf_re_range(mpc_val_t *x) {

  mpc_parser_t *out;
  size_t i, j;
  size_t start, end;
  const char *tmp = NULL;
  const char *s = x;
  int comp = s[0] == '^' ? 1 : 0;
  char *range = calloc(1,1);

  if (s[0] == '\0') { free(range); free(x); return mpc_fail("Invalid Regex Range Expression"); }
  if (s[0] == '^' &&
      s[1] == '\0') { free(range); free(x); return mpc_fail("Invalid Regex Range Expression"); }

  for (i = comp; i < strlen(s); i++){

    /* Regex Range Escape */
    if (s[i] == '\\') {
      tmp = mpc_re_range_escape_char(s[i+1]);
      if (tmp != NULL) {
        range = realloc(range, strlen(range) + strlen(tmp) + 1);
        strcat(range, tmp);
      } else {
        range = realloc(range, strlen(range) + 1 + 1);
        range[strlen(range) + 1] = '\0';
        range[strlen(range) + 0] = s[i+1];
      }
      i++;
    }

    /* Regex Range...Range */
    else if (s[i] == '-') {
      if (s[i+1] == '\0' || i == 0) {
          range = realloc(range, strlen(range) + strlen("-") + 1);
          strcat(range, "-");
      } else {
        start = s[i-1]+1;
        end = s[i+1]-1;
        for (j = start; j <= end; j++) {
          range = realloc(range, strlen(range) + 1 + 1 + 1);
          range[strlen(range) + 1] = '\0';
          range[strlen(range) + 0] = (char)j;
        }
      }
    }

    /* Regex Range Normal */
    else {
      range = realloc(range, strlen(range) + 1 + 1);
      range[strlen(range) + 1] = '\0';
      range[strlen(range) + 0] = s[i];
    }

  }

  out = comp == 1 ? mpc_noneof(range) : mpc_oneof(range);

  free(x);
  free(range);

  return out;
}